

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::is_boolean::test(is_boolean *this)

{
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  string local_160;
  allocator<char> local_139;
  string local_138;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string local_30;
  is_boolean *local_10;
  is_boolean *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"(boolean? #t)",&local_51);
  compile_fixture::run(&local_30,&this->super_compile_fixture,&local_50,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x73b,"void skiwi::(anonymous namespace)::is_boolean::test()");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"(boolean? #f)",&local_a9);
  compile_fixture::run(&local_88,&this->super_compile_fixture,&local_a8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x73c,"void skiwi::(anonymous namespace)::is_boolean::test()");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"(boolean? 0)",&local_f1);
  compile_fixture::run(&local_d0,&this->super_compile_fixture,&local_f0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x73d,"void skiwi::(anonymous namespace)::is_boolean::test()");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"(boolean? 1)",&local_139)
  ;
  compile_fixture::run(&local_118,&this->super_compile_fixture,&local_138,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x73e,"void skiwi::(anonymous namespace)::is_boolean::test()");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"(boolean? -1)",&local_181);
  compile_fixture::run(&local_160,&this->super_compile_fixture,&local_180,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_160,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x73f,"void skiwi::(anonymous namespace)::is_boolean::test()");
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"(boolean? ())",&local_1c9);
  compile_fixture::run(&local_1a8,&this->super_compile_fixture,&local_1c8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x740,"void skiwi::(anonymous namespace)::is_boolean::test()");
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"(boolean? #\\a)",&local_211);
  compile_fixture::run(&local_1f0,&this->super_compile_fixture,&local_210,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_1f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x741,"void skiwi::(anonymous namespace)::is_boolean::test()");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"(boolean? (boolean? 0))",&local_259);
  compile_fixture::run(&local_238,&this->super_compile_fixture,&local_258,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_238,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x742,"void skiwi::(anonymous namespace)::is_boolean::test()");
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"(boolean? (fixnum? (boolean? 0)))",&local_2a1);
  compile_fixture::run(&local_280,&this->super_compile_fixture,&local_2a0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_280,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x743,"void skiwi::(anonymous namespace)::is_boolean::test()");
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  return;
}

Assistant:

void test()
      {
      TEST_EQ("#t", run("(boolean? #t)"));
      TEST_EQ("#t", run("(boolean? #f)"));
      TEST_EQ("#f", run("(boolean? 0)"));
      TEST_EQ("#f", run("(boolean? 1)"));
      TEST_EQ("#f", run("(boolean? -1)"));
      TEST_EQ("#f", run("(boolean? ())"));
      TEST_EQ("#f", run(R"((boolean? #\a))"));
      TEST_EQ("#t", run("(boolean? (boolean? 0))"));
      TEST_EQ("#t", run("(boolean? (fixnum? (boolean? 0)))"));
      }